

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

void toml::detail::
     change_region<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
               (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v,region *reg)

{
  std::make_shared<toml::detail::region,toml::detail::region>((region *)&stack0xffffffffffffffe0);
  std::__shared_ptr<toml::detail::region_base,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<toml::detail::region_base,(__gnu_cxx::_Lock_policy)2> *)&v->region_info_,
             (__shared_ptr<toml::detail::region,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffe0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void change_region(Value& v, region reg)
{
    v.region_info_ = std::make_shared<region>(std::move(reg));
    return;
}